

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_random_round_trip.cpp
# Opt level: O2

void __thiscall randomRoundTrip_basic_Test::TestBody(randomRoundTrip_basic_Test *this)

{
  unsigned_long __res;
  ulong uVar1;
  unit *units;
  uint64_t match_flags;
  unit *match_flags_00;
  char *message;
  int iVar2;
  bool bVar3;
  precise_unit pVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  unit startunit;
  AssertionResult gtest_ar;
  AssertHelper local_90;
  unit resunit;
  default_random_engine engine;
  uniform_int_distribution<unsigned_int> distribution;
  string local_70;
  string str;
  
  uVar1 = std::chrono::_V2::system_clock::now();
  engine._M_x = uVar1 % 0x7fffffff + (ulong)(uVar1 % 0x7fffffff == 0);
  match_flags_00 = (unit *)&distribution;
  distribution._M_param._M_a = 0;
  distribution._M_param._M_b = 0xffffffff;
  iVar2 = 6000;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    startunit.base_units_ =
         (unit_data)std::uniform_int_distribution<unsigned_int>::operator()(&distribution,&engine);
    startunit.multiplier_ = 1.0;
    units = (unit *)::units::getDefaultFlags();
    ::units::to_string_abi_cxx11_(&str,(units *)&startunit,units,(uint64_t)match_flags_00);
    std::__cxx11::string::string((string *)&local_70,(string *)&str);
    match_flags = ::units::getDefaultFlags();
    pVar4 = ::units::unit_from_string(&local_70,match_flags);
    resunit = (unit)((ulong)(uint)(float)pVar4.multiplier_ | pVar4._8_8_ << 0x20);
    std::__cxx11::string::~string((string *)&local_70);
    match_flags_00 = &startunit;
    testing::internal::CmpHelperEQ<units::unit,units::unit>
              ((internal *)&gtest_ar,"startunit","resunit",&startunit,&resunit);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_b0);
      std::operator<<((ostream *)(local_b0._M_head_impl + 0x10),"round trip failed ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_b0._M_head_impl + 0x10));
      message = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      match_flags_00 = (unit *)0x23;
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_random_round_trip.cpp"
                 ,0x23,message);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if (local_b0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_b0._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    std::__cxx11::string::~string((string *)&str);
  }
  return;
}

Assistant:

TEST(randomRoundTrip, basic)
{
    if (sizeof(UNITS_BASE_TYPE) == 4) {
        std::default_random_engine engine(
            std::chrono::system_clock::now().time_since_epoch().count());
        std::uniform_int_distribution<unsigned int> distribution(
            0, std::numeric_limits<unsigned int>::max());

        for (auto ii = 0; ii < 6000; ++ii) {
            auto start = distribution(engine);
            detail::unit_data unitdata(nullptr);
            memcpy(static_cast<void*>(&unitdata), &start, 4);
            auto startunit = unit(unitdata);
            auto str = to_string(startunit);
            auto resunit = unit_cast(unit_from_string(str));
            EXPECT_EQ(startunit, resunit) << "round trip failed " << start;
        }
    }
}